

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O1

void __thiscall Colony::~Colony(Colony *this)

{
  ~Colony(this);
  operator_delete(this);
  return;
}

Assistant:

Colony::~Colony()
{ 
	std::cout << "destructor!!" << std::endl;
	for(int i = 0; i < num_node; i++){
		delete[] phero_matrix[i];
		phero_matrix[i] = nullptr;
		delete[] etha_matrix[i];
		etha_matrix[i] = nullptr;
	}
	delete[] phero_matrix;
	phero_matrix = nullptr;
	delete[] etha_matrix;
	etha_matrix = nullptr;
}